

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_1048576,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  long lVar5;
  RTCIntersectArguments *pRVar6;
  undefined1 auVar7 [32];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 (*pauVar45) [16];
  undefined4 uVar46;
  ulong uVar47;
  undefined1 (*pauVar48) [16];
  ulong uVar49;
  ulong uVar50;
  int *piVar51;
  RTCRayQueryContext *pRVar52;
  ulong uVar53;
  undefined1 (*pauVar54) [16];
  uint uVar55;
  ulong *puVar56;
  long lVar57;
  undefined1 (*pauVar58) [16];
  long lVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  float fVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar74;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar72;
  float fVar73;
  undefined1 auVar71 [64];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar119 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar129;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  uint uVar132;
  uint uVar133;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  uint uVar134;
  undefined1 auVar135 [64];
  float fVar136;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar137 [64];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [16];
  undefined1 auVar148 [64];
  undefined1 auVar149 [16];
  undefined1 auVar150 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined8 local_2670;
  undefined8 uStack_2668;
  undefined1 local_2640 [8];
  undefined8 uStack_2638;
  int local_2614;
  undefined1 local_2610 [16];
  undefined1 local_2600 [16];
  undefined1 local_25f0 [16];
  undefined1 local_25e0 [16];
  undefined1 local_25d0 [16];
  RTCFilterFunctionNArguments local_25c0;
  undefined1 local_2590 [16];
  undefined4 local_2580;
  undefined4 local_257c;
  undefined4 local_2578;
  float local_2574;
  float local_2570;
  undefined4 local_256c;
  uint local_2568;
  uint local_2564;
  uint local_2560;
  undefined8 local_2550;
  undefined8 uStack_2548;
  undefined1 local_2540 [32];
  undefined1 local_2520 [16];
  undefined1 local_2510 [16];
  undefined1 local_24f0 [16];
  float local_24e0 [4];
  float local_24d0 [4];
  undefined1 local_24c0 [16];
  undefined1 local_24b0 [16];
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 local_2490;
  undefined8 uStack_2488;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    pauVar48 = (undefined1 (*) [16])local_2390;
    uStack_2398 = 0;
    aVar4 = (ray->super_RayK<1>).dir.field_0;
    auVar75 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar88 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar103._8_4_ = 0x7fffffff;
    auVar103._0_8_ = 0x7fffffff7fffffff;
    auVar103._12_4_ = 0x7fffffff;
    auVar103 = vandps_avx((undefined1  [16])aVar4,auVar103);
    auVar108._8_4_ = 0x219392ef;
    auVar108._0_8_ = 0x219392ef219392ef;
    auVar108._12_4_ = 0x219392ef;
    auVar103 = vcmpps_avx(auVar103,auVar108,1);
    auVar103 = vblendvps_avx((undefined1  [16])aVar4,auVar108,auVar103);
    auVar108 = vrcpps_avx(auVar103);
    fVar65 = auVar108._0_4_;
    auVar96._0_4_ = auVar103._0_4_ * fVar65;
    fVar72 = auVar108._4_4_;
    auVar96._4_4_ = auVar103._4_4_ * fVar72;
    fVar73 = auVar108._8_4_;
    auVar96._8_4_ = auVar103._8_4_ * fVar73;
    fVar74 = auVar108._12_4_;
    auVar96._12_4_ = auVar103._12_4_ * fVar74;
    auVar109._8_4_ = 0x3f800000;
    auVar109._0_8_ = 0x3f8000003f800000;
    auVar109._12_4_ = 0x3f800000;
    auVar103 = vsubps_avx(auVar109,auVar96);
    auVar97._0_4_ = fVar65 + fVar65 * auVar103._0_4_;
    auVar97._4_4_ = fVar72 + fVar72 * auVar103._4_4_;
    auVar97._8_4_ = fVar73 + fVar73 * auVar103._8_4_;
    auVar97._12_4_ = fVar74 + fVar74 * auVar103._12_4_;
    uVar46 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_23e0._4_4_ = uVar46;
    local_23e0._0_4_ = uVar46;
    local_23e0._8_4_ = uVar46;
    local_23e0._12_4_ = uVar46;
    local_23e0._16_4_ = uVar46;
    local_23e0._20_4_ = uVar46;
    local_23e0._24_4_ = uVar46;
    local_23e0._28_4_ = uVar46;
    auVar135 = ZEXT3264(local_23e0);
    uVar46 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_2400._4_4_ = uVar46;
    local_2400._0_4_ = uVar46;
    local_2400._8_4_ = uVar46;
    local_2400._12_4_ = uVar46;
    local_2400._16_4_ = uVar46;
    local_2400._20_4_ = uVar46;
    local_2400._24_4_ = uVar46;
    local_2400._28_4_ = uVar46;
    auVar137 = ZEXT3264(local_2400);
    uVar46 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_2420._4_4_ = uVar46;
    local_2420._0_4_ = uVar46;
    local_2420._8_4_ = uVar46;
    local_2420._12_4_ = uVar46;
    local_2420._16_4_ = uVar46;
    local_2420._20_4_ = uVar46;
    local_2420._24_4_ = uVar46;
    local_2420._28_4_ = uVar46;
    auVar145 = ZEXT3264(local_2420);
    auVar103 = vshufps_avx(auVar97,auVar97,0);
    local_2440._16_16_ = auVar103;
    local_2440._0_16_ = auVar103;
    auVar146 = ZEXT3264(local_2440);
    auVar103 = vmovshdup_avx(auVar97);
    auVar108 = vshufps_avx(auVar97,auVar97,0x55);
    local_2460._16_16_ = auVar108;
    local_2460._0_16_ = auVar108;
    auVar148 = ZEXT3264(local_2460);
    auVar108 = vshufpd_avx(auVar97,auVar97,1);
    auVar96 = vshufps_avx(auVar97,auVar97,0xaa);
    local_2480._16_16_ = auVar96;
    local_2480._0_16_ = auVar96;
    auVar150 = ZEXT3264(local_2480);
    uVar60 = (ulong)(auVar97._0_4_ < 0.0) << 3;
    uVar47 = (ulong)(auVar103._0_4_ < 0.0);
    lVar1 = uVar47 * 8;
    uVar49 = (ulong)(auVar108._0_4_ < 0.0);
    lVar2 = uVar49 * 8;
    auVar103 = vshufps_avx(auVar75,auVar75,0);
    local_23c0._16_16_ = auVar103;
    local_23c0._0_16_ = auVar103;
    auVar103 = vshufps_avx(auVar88,auVar88,0);
    auVar71 = ZEXT3264(CONCAT1616(auVar103,auVar103));
    uVar61 = uVar60 ^ 8;
    uVar62 = lVar1 + 0x10U ^ 8;
    uVar64 = lVar2 + 0x20U ^ 8;
    local_2550 = mm_lookupmask_ps._240_8_;
    uStack_2548 = mm_lookupmask_ps._248_8_;
LAB_014de959:
    do {
      pauVar45 = pauVar48 + -1;
      pauVar48 = pauVar48 + -1;
      if (*(float *)(*pauVar45 + 8) <= (ray->super_RayK<1>).tfar) {
        pauVar45 = pauVar48;
        uVar53 = *(ulong *)*pauVar48;
        while (pauVar48 = pauVar45, (uVar53 & 8) == 0) {
          uVar50 = uVar53 & 0xfffffffffffffff0;
          puVar56 = (ulong *)(uVar50 + 0x40);
          if (uVar50 == 0) {
            puVar56 = (ulong *)0x0;
          }
          auVar75._8_8_ = 0;
          auVar75._0_8_ = *puVar56;
          auVar98._8_8_ = 0;
          auVar98._0_8_ = puVar56[1];
          auVar103 = vpminub_avx(auVar75,auVar98);
          auVar103 = vpcmpeqb_avx(auVar75,auVar103);
          auVar88._8_8_ = 0;
          auVar88._0_8_ = *(ulong *)((long)puVar56 + 4);
          auVar104._8_8_ = 0;
          auVar104._0_8_ = *(ulong *)((long)puVar56 + 0xc);
          auVar75 = vpminub_avx(auVar88,auVar104);
          auVar75 = vpcmpeqb_avx(auVar88,auVar75);
          fVar65 = *(float *)(puVar56 + 6);
          fVar72 = *(float *)((long)puVar56 + 0x3c);
          auVar99._8_8_ = 0;
          auVar99._0_8_ = *(ulong *)((long)puVar56 + uVar60);
          auVar88 = vpmovzxbd_avx(auVar99);
          auVar113._8_8_ = 0;
          auVar113._0_8_ = *(ulong *)((long)puVar56 + uVar60 + 4);
          auVar108 = vpmovzxbd_avx(auVar113);
          auVar101._16_16_ = auVar108;
          auVar101._0_16_ = auVar88;
          auVar101 = vcvtdq2ps_avx(auVar101);
          auVar102._0_4_ = fVar65 + fVar72 * auVar101._0_4_;
          auVar102._4_4_ = fVar65 + fVar72 * auVar101._4_4_;
          auVar102._8_4_ = fVar65 + fVar72 * auVar101._8_4_;
          auVar102._12_4_ = fVar65 + fVar72 * auVar101._12_4_;
          auVar102._16_4_ = fVar65 + fVar72 * auVar101._16_4_;
          auVar102._20_4_ = fVar65 + fVar72 * auVar101._20_4_;
          auVar102._24_4_ = fVar65 + fVar72 * auVar101._24_4_;
          auVar102._28_4_ = fVar65 + auVar101._28_4_;
          auVar114._8_8_ = 0;
          auVar114._0_8_ = *(ulong *)((long)puVar56 + uVar61);
          auVar88 = vpmovzxbd_avx(auVar114);
          auVar117._8_8_ = 0;
          auVar117._0_8_ = *(ulong *)((long)puVar56 + uVar61 + 4);
          auVar108 = vpmovzxbd_avx(auVar117);
          auVar115._16_16_ = auVar108;
          auVar115._0_16_ = auVar88;
          auVar101 = vcvtdq2ps_avx(auVar115);
          auVar107._0_4_ = fVar65 + fVar72 * auVar101._0_4_;
          auVar107._4_4_ = fVar65 + fVar72 * auVar101._4_4_;
          auVar107._8_4_ = fVar65 + fVar72 * auVar101._8_4_;
          auVar107._12_4_ = fVar65 + fVar72 * auVar101._12_4_;
          auVar107._16_4_ = fVar65 + fVar72 * auVar101._16_4_;
          auVar107._20_4_ = fVar65 + fVar72 * auVar101._20_4_;
          auVar107._24_4_ = fVar65 + fVar72 * auVar101._24_4_;
          auVar107._28_4_ = fVar65 + fVar72;
          fVar65 = *(float *)((long)puVar56 + 0x34);
          fVar72 = *(float *)(puVar56 + 8);
          auVar110._8_8_ = 0;
          auVar110._0_8_ = puVar56[uVar47 + 2];
          auVar88 = vpmovzxbd_avx(auVar110);
          auVar122._8_8_ = 0;
          auVar122._0_8_ = *(ulong *)((long)puVar56 + lVar1 + 0x14);
          auVar108 = vpmovzxbd_avx(auVar122);
          auVar111._16_16_ = auVar108;
          auVar111._0_16_ = auVar88;
          auVar101 = vcvtdq2ps_avx(auVar111);
          auVar112._0_4_ = fVar65 + fVar72 * auVar101._0_4_;
          auVar112._4_4_ = fVar65 + fVar72 * auVar101._4_4_;
          auVar112._8_4_ = fVar65 + fVar72 * auVar101._8_4_;
          auVar112._12_4_ = fVar65 + fVar72 * auVar101._12_4_;
          auVar112._16_4_ = fVar65 + fVar72 * auVar101._16_4_;
          auVar112._20_4_ = fVar65 + fVar72 * auVar101._20_4_;
          auVar112._24_4_ = fVar65 + fVar72 * auVar101._24_4_;
          auVar112._28_4_ = fVar65 + auVar101._28_4_;
          auVar123._8_8_ = 0;
          auVar123._0_8_ = *(ulong *)((long)puVar56 + uVar62);
          auVar88 = vpmovzxbd_avx(auVar123);
          auVar130._8_8_ = 0;
          auVar130._0_8_ = *(ulong *)((long)puVar56 + uVar62 + 4);
          auVar108 = vpmovzxbd_avx(auVar130);
          auVar126._16_16_ = auVar108;
          auVar126._0_16_ = auVar88;
          auVar101 = vcvtdq2ps_avx(auVar126);
          auVar116._0_4_ = fVar65 + auVar101._0_4_ * fVar72;
          auVar116._4_4_ = fVar65 + auVar101._4_4_ * fVar72;
          auVar116._8_4_ = fVar65 + auVar101._8_4_ * fVar72;
          auVar116._12_4_ = fVar65 + auVar101._12_4_ * fVar72;
          auVar116._16_4_ = fVar65 + auVar101._16_4_ * fVar72;
          auVar116._20_4_ = fVar65 + auVar101._20_4_ * fVar72;
          auVar116._24_4_ = fVar65 + auVar101._24_4_ * fVar72;
          auVar116._28_4_ = fVar65 + fVar72;
          auVar118._8_8_ = 0;
          auVar118._0_8_ = puVar56[uVar49 + 4];
          auVar88 = vpmovzxbd_avx(auVar118);
          auVar124._8_8_ = 0;
          auVar124._0_8_ = *(ulong *)((long)puVar56 + lVar2 + 0x24);
          auVar108 = vpmovzxbd_avx(auVar124);
          auVar120._16_16_ = auVar108;
          auVar120._0_16_ = auVar88;
          auVar125._8_8_ = 0;
          auVar125._0_8_ = *(ulong *)((long)puVar56 + uVar64);
          auVar88 = vpmovzxbd_avx(auVar125);
          auVar131._8_8_ = 0;
          auVar131._0_8_ = *(ulong *)((long)puVar56 + uVar64 + 4);
          auVar108 = vpmovzxbd_avx(auVar131);
          auVar127._16_16_ = auVar108;
          auVar127._0_16_ = auVar88;
          fVar65 = *(float *)((long)puVar56 + 0x44);
          auVar101 = vcvtdq2ps_avx(auVar120);
          auVar7 = vcvtdq2ps_avx(auVar127);
          fVar72 = *(float *)(puVar56 + 7);
          auVar121._0_4_ = fVar72 + fVar65 * auVar101._0_4_;
          auVar121._4_4_ = fVar72 + fVar65 * auVar101._4_4_;
          auVar121._8_4_ = fVar72 + fVar65 * auVar101._8_4_;
          auVar121._12_4_ = fVar72 + fVar65 * auVar101._12_4_;
          auVar121._16_4_ = fVar72 + fVar65 * auVar101._16_4_;
          auVar121._20_4_ = fVar72 + fVar65 * auVar101._20_4_;
          auVar121._24_4_ = fVar72 + fVar65 * auVar101._24_4_;
          auVar121._28_4_ = fVar72 + auVar101._28_4_;
          auVar128._0_4_ = fVar72 + fVar65 * auVar7._0_4_;
          auVar128._4_4_ = fVar72 + fVar65 * auVar7._4_4_;
          auVar128._8_4_ = fVar72 + fVar65 * auVar7._8_4_;
          auVar128._12_4_ = fVar72 + fVar65 * auVar7._12_4_;
          auVar128._16_4_ = fVar72 + fVar65 * auVar7._16_4_;
          auVar128._20_4_ = fVar72 + fVar65 * auVar7._20_4_;
          auVar128._24_4_ = fVar72 + fVar65 * auVar7._24_4_;
          auVar128._28_4_ = fVar72 + auVar7._28_4_;
          auVar101 = vsubps_avx(auVar102,auVar135._0_32_);
          auVar7._4_4_ = auVar146._4_4_ * auVar101._4_4_;
          auVar7._0_4_ = auVar146._0_4_ * auVar101._0_4_;
          auVar7._8_4_ = auVar146._8_4_ * auVar101._8_4_;
          auVar7._12_4_ = auVar146._12_4_ * auVar101._12_4_;
          auVar7._16_4_ = auVar146._16_4_ * auVar101._16_4_;
          auVar7._20_4_ = auVar146._20_4_ * auVar101._20_4_;
          auVar7._24_4_ = auVar146._24_4_ * auVar101._24_4_;
          auVar7._28_4_ = auVar101._28_4_;
          auVar101 = vsubps_avx(auVar112,auVar137._0_32_);
          auVar19._4_4_ = auVar148._4_4_ * auVar101._4_4_;
          auVar19._0_4_ = auVar148._0_4_ * auVar101._0_4_;
          auVar19._8_4_ = auVar148._8_4_ * auVar101._8_4_;
          auVar19._12_4_ = auVar148._12_4_ * auVar101._12_4_;
          auVar19._16_4_ = auVar148._16_4_ * auVar101._16_4_;
          auVar19._20_4_ = auVar148._20_4_ * auVar101._20_4_;
          auVar19._24_4_ = auVar148._24_4_ * auVar101._24_4_;
          auVar19._28_4_ = auVar101._28_4_;
          auVar101 = vmaxps_avx(auVar7,auVar19);
          auVar7 = vsubps_avx(auVar121,auVar145._0_32_);
          auVar20._4_4_ = auVar150._4_4_ * auVar7._4_4_;
          auVar20._0_4_ = auVar150._0_4_ * auVar7._0_4_;
          auVar20._8_4_ = auVar150._8_4_ * auVar7._8_4_;
          auVar20._12_4_ = auVar150._12_4_ * auVar7._12_4_;
          auVar20._16_4_ = auVar150._16_4_ * auVar7._16_4_;
          auVar20._20_4_ = auVar150._20_4_ * auVar7._20_4_;
          auVar20._24_4_ = auVar150._24_4_ * auVar7._24_4_;
          auVar20._28_4_ = auVar7._28_4_;
          auVar7 = vmaxps_avx(auVar20,local_23c0);
          local_2540 = vmaxps_avx(auVar101,auVar7);
          auVar101 = vsubps_avx(auVar107,auVar135._0_32_);
          auVar21._4_4_ = auVar146._4_4_ * auVar101._4_4_;
          auVar21._0_4_ = auVar146._0_4_ * auVar101._0_4_;
          auVar21._8_4_ = auVar146._8_4_ * auVar101._8_4_;
          auVar21._12_4_ = auVar146._12_4_ * auVar101._12_4_;
          auVar21._16_4_ = auVar146._16_4_ * auVar101._16_4_;
          auVar21._20_4_ = auVar146._20_4_ * auVar101._20_4_;
          auVar21._24_4_ = auVar146._24_4_ * auVar101._24_4_;
          auVar21._28_4_ = auVar101._28_4_;
          auVar101 = vsubps_avx(auVar116,auVar137._0_32_);
          auVar22._4_4_ = auVar148._4_4_ * auVar101._4_4_;
          auVar22._0_4_ = auVar148._0_4_ * auVar101._0_4_;
          auVar22._8_4_ = auVar148._8_4_ * auVar101._8_4_;
          auVar22._12_4_ = auVar148._12_4_ * auVar101._12_4_;
          auVar22._16_4_ = auVar148._16_4_ * auVar101._16_4_;
          auVar22._20_4_ = auVar148._20_4_ * auVar101._20_4_;
          auVar22._24_4_ = auVar148._24_4_ * auVar101._24_4_;
          auVar22._28_4_ = auVar101._28_4_;
          auVar101 = vminps_avx(auVar21,auVar22);
          auVar7 = vsubps_avx(auVar128,auVar145._0_32_);
          auVar23._4_4_ = auVar150._4_4_ * auVar7._4_4_;
          auVar23._0_4_ = auVar150._0_4_ * auVar7._0_4_;
          auVar23._8_4_ = auVar150._8_4_ * auVar7._8_4_;
          auVar23._12_4_ = auVar150._12_4_ * auVar7._12_4_;
          auVar23._16_4_ = auVar150._16_4_ * auVar7._16_4_;
          auVar23._20_4_ = auVar150._20_4_ * auVar7._20_4_;
          auVar23._24_4_ = auVar150._24_4_ * auVar7._24_4_;
          auVar23._28_4_ = auVar7._28_4_;
          auVar7 = vminps_avx(auVar23,auVar71._0_32_);
          auVar7 = vminps_avx(auVar101,auVar7);
          auVar101 = vcmpps_avx(local_2540,auVar7,2);
          auVar88 = vpcmpeqd_avx(auVar7._0_16_,auVar7._0_16_);
          auVar103 = vpmovsxbd_avx(auVar103 ^ auVar88);
          auVar75 = vpmovsxbd_avx(auVar75 ^ auVar88);
          auVar87._16_16_ = auVar75;
          auVar87._0_16_ = auVar103;
          auVar7 = vcvtdq2ps_avx(auVar87);
          auVar95._8_4_ = 0xbf800000;
          auVar95._0_8_ = 0xbf800000bf800000;
          auVar95._12_4_ = 0xbf800000;
          auVar95._16_4_ = 0xbf800000;
          auVar95._20_4_ = 0xbf800000;
          auVar95._24_4_ = 0xbf800000;
          auVar95._28_4_ = 0xbf800000;
          auVar7 = vcmpps_avx(auVar95,auVar7,1);
          auVar101 = vandps_avx(auVar101,auVar7);
          uVar55 = vmovmskps_avx(auVar101);
          if (uVar55 == 0) {
            if (pauVar48 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            goto LAB_014de959;
          }
          uVar55 = uVar55 & 0xff;
          lVar59 = 0;
          if (uVar55 != 0) {
            for (; (uVar55 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
            }
          }
          uVar53 = *(ulong *)(uVar50 + lVar59 * 8);
          uVar55 = uVar55 - 1 & uVar55;
          pauVar45 = pauVar48;
          if (uVar55 != 0) {
            uVar132 = *(uint *)(local_2540 + lVar59 * 4);
            lVar59 = 0;
            if (uVar55 != 0) {
              for (; (uVar55 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
              }
            }
            uVar63 = *(ulong *)(uVar50 + lVar59 * 8);
            uVar133 = *(uint *)(local_2540 + lVar59 * 4);
            uVar55 = uVar55 - 1 & uVar55;
            if (uVar55 == 0) {
              pauVar45 = pauVar48 + 1;
              if (uVar132 < uVar133) {
                *(ulong *)*pauVar48 = uVar63;
                *(uint *)(*pauVar48 + 8) = uVar133;
              }
              else {
                *(ulong *)*pauVar48 = uVar53;
                *(uint *)(*pauVar48 + 8) = uVar132;
                uVar53 = uVar63;
              }
            }
            else {
              auVar76._8_8_ = 0;
              auVar76._0_8_ = uVar53;
              auVar103 = vpunpcklqdq_avx(auVar76,ZEXT416(uVar132));
              auVar89._8_8_ = 0;
              auVar89._0_8_ = uVar63;
              auVar75 = vpunpcklqdq_avx(auVar89,ZEXT416(uVar133));
              lVar59 = 0;
              if (uVar55 != 0) {
                for (; (uVar55 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
                }
              }
              auVar100._8_8_ = 0;
              auVar100._0_8_ = *(ulong *)(uVar50 + lVar59 * 8);
              auVar88 = vpunpcklqdq_avx(auVar100,ZEXT416(*(uint *)(local_2540 + lVar59 * 4)));
              uVar55 = uVar55 - 1 & uVar55;
              if (uVar55 == 0) {
                auVar108 = vpcmpgtd_avx(auVar75,auVar103);
                auVar96 = vpshufd_avx(auVar108,0xaa);
                auVar108 = vblendvps_avx(auVar75,auVar103,auVar96);
                auVar103 = vblendvps_avx(auVar103,auVar75,auVar96);
                auVar75 = vpcmpgtd_avx(auVar88,auVar108);
                auVar96 = vpshufd_avx(auVar75,0xaa);
                auVar75 = vblendvps_avx(auVar88,auVar108,auVar96);
                auVar88 = vblendvps_avx(auVar108,auVar88,auVar96);
                auVar108 = vpcmpgtd_avx(auVar88,auVar103);
                auVar96 = vpshufd_avx(auVar108,0xaa);
                auVar108 = vblendvps_avx(auVar88,auVar103,auVar96);
                auVar103 = vblendvps_avx(auVar103,auVar88,auVar96);
                *pauVar48 = auVar103;
                pauVar48[1] = auVar108;
                uVar53 = auVar75._0_8_;
                pauVar45 = pauVar48 + 2;
              }
              else {
                lVar59 = 0;
                if (uVar55 != 0) {
                  for (; (uVar55 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
                  }
                }
                auVar105._8_8_ = 0;
                auVar105._0_8_ = *(ulong *)(uVar50 + lVar59 * 8);
                auVar108 = vpunpcklqdq_avx(auVar105,ZEXT416(*(uint *)(local_2540 + lVar59 * 4)));
                uVar55 = uVar55 - 1 & uVar55;
                uVar63 = (ulong)uVar55;
                if (uVar55 == 0) {
                  auVar96 = vpcmpgtd_avx(auVar75,auVar103);
                  auVar97 = vpshufd_avx(auVar96,0xaa);
                  auVar96 = vblendvps_avx(auVar75,auVar103,auVar97);
                  auVar103 = vblendvps_avx(auVar103,auVar75,auVar97);
                  auVar75 = vpcmpgtd_avx(auVar108,auVar88);
                  auVar97 = vpshufd_avx(auVar75,0xaa);
                  auVar75 = vblendvps_avx(auVar108,auVar88,auVar97);
                  auVar88 = vblendvps_avx(auVar88,auVar108,auVar97);
                  auVar108 = vpcmpgtd_avx(auVar88,auVar103);
                  auVar97 = vpshufd_avx(auVar108,0xaa);
                  auVar108 = vblendvps_avx(auVar88,auVar103,auVar97);
                  auVar103 = vblendvps_avx(auVar103,auVar88,auVar97);
                  auVar88 = vpcmpgtd_avx(auVar75,auVar96);
                  auVar97 = vpshufd_avx(auVar88,0xaa);
                  auVar88 = vblendvps_avx(auVar75,auVar96,auVar97);
                  auVar75 = vblendvps_avx(auVar96,auVar75,auVar97);
                  auVar96 = vpcmpgtd_avx(auVar108,auVar75);
                  auVar97 = vpshufd_avx(auVar96,0xaa);
                  auVar96 = vblendvps_avx(auVar108,auVar75,auVar97);
                  auVar75 = vblendvps_avx(auVar75,auVar108,auVar97);
                  *pauVar48 = auVar103;
                  pauVar48[1] = auVar75;
                  pauVar48[2] = auVar96;
                  uVar53 = auVar88._0_8_;
                  pauVar45 = pauVar48 + 3;
                }
                else {
                  *pauVar48 = auVar103;
                  pauVar48[1] = auVar75;
                  pauVar48[2] = auVar88;
                  pauVar48[3] = auVar108;
                  lVar59 = 0x30;
                  do {
                    lVar57 = lVar59;
                    lVar59 = 0;
                    if (uVar63 != 0) {
                      for (; (uVar63 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
                      }
                    }
                    uVar53 = *(ulong *)(uVar50 + lVar59 * 8);
                    auVar77._8_8_ = 0;
                    auVar77._0_8_ = uVar53;
                    auVar103 = vpunpcklqdq_avx(auVar77,ZEXT416(*(uint *)(local_2540 + lVar59 * 4)));
                    *(undefined1 (*) [16])(pauVar48[1] + lVar57) = auVar103;
                    uVar63 = uVar63 & uVar63 - 1;
                    lVar59 = lVar57 + 0x10;
                  } while (uVar63 != 0);
                  pauVar45 = (undefined1 (*) [16])(pauVar48[1] + lVar57);
                  if (lVar57 + 0x10 != 0) {
                    lVar59 = 0x10;
                    pauVar58 = pauVar48;
                    do {
                      auVar103 = pauVar58[1];
                      pauVar58 = pauVar58 + 1;
                      uVar55 = vextractps_avx(auVar103,2);
                      lVar57 = lVar59;
                      do {
                        if (uVar55 <= *(uint *)(pauVar48[-1] + lVar57 + 8)) {
                          pauVar54 = (undefined1 (*) [16])(*pauVar48 + lVar57);
                          break;
                        }
                        *(undefined1 (*) [16])(*pauVar48 + lVar57) =
                             *(undefined1 (*) [16])(pauVar48[-1] + lVar57);
                        lVar57 = lVar57 + -0x10;
                        pauVar54 = pauVar48;
                      } while (lVar57 != 0);
                      *pauVar54 = auVar103;
                      lVar59 = lVar59 + 0x10;
                    } while (pauVar45 != pauVar58);
                    uVar53 = *(ulong *)*pauVar45;
                  }
                }
              }
            }
          }
        }
        uVar50 = (ulong)((uint)uVar53 & 0xf);
        if (uVar50 != 8) {
          uVar53 = uVar53 & 0xfffffffffffffff0;
          lVar59 = 0;
          do {
            lVar57 = lVar59 * 0xb0;
            pfVar3 = (float *)(uVar53 + 0x80 + lVar57);
            fVar24 = *pfVar3;
            fVar25 = pfVar3[1];
            fVar26 = pfVar3[2];
            fVar27 = pfVar3[3];
            pfVar3 = (float *)(uVar53 + 0x40 + lVar57);
            fVar28 = *pfVar3;
            fVar29 = pfVar3[1];
            fVar30 = pfVar3[2];
            fVar31 = pfVar3[3];
            auVar66._0_4_ = fVar24 * fVar28;
            auVar66._4_4_ = fVar25 * fVar29;
            auVar66._8_4_ = fVar26 * fVar30;
            auVar66._12_4_ = fVar27 * fVar31;
            pfVar3 = (float *)(uVar53 + 0x70 + lVar57);
            fVar32 = *pfVar3;
            fVar33 = pfVar3[1];
            fVar34 = pfVar3[2];
            fVar35 = pfVar3[3];
            pfVar3 = (float *)(uVar53 + 0x50 + lVar57);
            fVar36 = *pfVar3;
            fVar37 = pfVar3[1];
            fVar38 = pfVar3[2];
            fVar39 = pfVar3[3];
            auVar78._0_4_ = fVar32 * fVar36;
            auVar78._4_4_ = fVar33 * fVar37;
            auVar78._8_4_ = fVar34 * fVar38;
            auVar78._12_4_ = fVar35 * fVar39;
            local_2600 = vsubps_avx(auVar78,auVar66);
            auVar103 = *(undefined1 (*) [16])(uVar53 + 0x60 + lVar57);
            fVar136 = auVar103._0_4_;
            auVar79._0_4_ = fVar136 * fVar36;
            fVar138 = auVar103._4_4_;
            auVar79._4_4_ = fVar138 * fVar37;
            fVar139 = auVar103._8_4_;
            auVar79._8_4_ = fVar139 * fVar38;
            fVar140 = auVar103._12_4_;
            auVar79._12_4_ = fVar140 * fVar39;
            pfVar3 = (float *)(uVar53 + 0x30 + lVar57);
            fVar40 = *pfVar3;
            fVar41 = pfVar3[1];
            fVar42 = pfVar3[2];
            fVar43 = pfVar3[3];
            auVar90._0_4_ = fVar24 * fVar40;
            auVar90._4_4_ = fVar25 * fVar41;
            auVar90._8_4_ = fVar26 * fVar42;
            auVar90._12_4_ = fVar27 * fVar43;
            auVar88 = vsubps_avx(auVar90,auVar79);
            auVar91._0_4_ = fVar32 * fVar40;
            auVar91._4_4_ = fVar33 * fVar41;
            auVar91._8_4_ = fVar34 * fVar42;
            auVar91._12_4_ = fVar35 * fVar43;
            auVar141._0_4_ = fVar136 * fVar28;
            auVar141._4_4_ = fVar138 * fVar29;
            auVar141._8_4_ = fVar139 * fVar30;
            auVar141._12_4_ = fVar140 * fVar31;
            auVar108 = vsubps_avx(auVar141,auVar91);
            uVar46 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar142._4_4_ = uVar46;
            auVar142._0_4_ = uVar46;
            auVar142._8_4_ = uVar46;
            auVar142._12_4_ = uVar46;
            local_2590 = vsubps_avx(*(undefined1 (*) [16])(uVar53 + lVar57),auVar142);
            uVar46 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar143._4_4_ = uVar46;
            auVar143._0_4_ = uVar46;
            auVar143._8_4_ = uVar46;
            auVar143._12_4_ = uVar46;
            auVar103 = vsubps_avx(*(undefined1 (*) [16])(uVar53 + 0x10 + lVar57),auVar143);
            uVar46 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar144._4_4_ = uVar46;
            auVar144._0_4_ = uVar46;
            auVar144._8_4_ = uVar46;
            auVar144._12_4_ = uVar46;
            local_2610 = vsubps_avx(*(undefined1 (*) [16])(uVar53 + 0x20 + lVar57),auVar144);
            fVar65 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar72 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar74 = local_2610._0_4_;
            auVar147._0_4_ = fVar65 * fVar74;
            fVar9 = local_2610._4_4_;
            auVar147._4_4_ = fVar65 * fVar9;
            fVar12 = local_2610._8_4_;
            auVar147._8_4_ = fVar65 * fVar12;
            fVar15 = local_2610._12_4_;
            auVar147._12_4_ = fVar65 * fVar15;
            fVar129 = auVar103._0_4_;
            auVar149._0_4_ = fVar72 * fVar129;
            fVar10 = auVar103._4_4_;
            auVar149._4_4_ = fVar72 * fVar10;
            fVar13 = auVar103._8_4_;
            auVar149._8_4_ = fVar72 * fVar13;
            fVar16 = auVar103._12_4_;
            auVar149._12_4_ = fVar72 * fVar16;
            auVar75 = vsubps_avx(auVar149,auVar147);
            fVar73 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar8 = local_2590._0_4_;
            auVar67._0_4_ = fVar72 * fVar8;
            fVar11 = local_2590._4_4_;
            auVar67._4_4_ = fVar72 * fVar11;
            fVar14 = local_2590._8_4_;
            auVar67._8_4_ = fVar72 * fVar14;
            fVar17 = local_2590._12_4_;
            auVar67._12_4_ = fVar72 * fVar17;
            auVar80._0_4_ = fVar73 * fVar74;
            auVar80._4_4_ = fVar73 * fVar9;
            auVar80._8_4_ = fVar73 * fVar12;
            auVar80._12_4_ = fVar73 * fVar15;
            auVar96 = vsubps_avx(auVar80,auVar67);
            auVar81._0_4_ = fVar73 * fVar129;
            auVar81._4_4_ = fVar73 * fVar10;
            auVar81._8_4_ = fVar73 * fVar13;
            auVar81._12_4_ = fVar73 * fVar16;
            auVar92._0_4_ = fVar65 * fVar8;
            auVar92._4_4_ = fVar65 * fVar11;
            auVar92._8_4_ = fVar65 * fVar14;
            auVar92._12_4_ = fVar65 * fVar17;
            auVar97 = vsubps_avx(auVar92,auVar81);
            auVar93._0_4_ =
                 local_2600._0_4_ * fVar73 + fVar65 * auVar88._0_4_ + fVar72 * auVar108._0_4_;
            auVar93._4_4_ =
                 local_2600._4_4_ * fVar73 + fVar65 * auVar88._4_4_ + fVar72 * auVar108._4_4_;
            auVar93._8_4_ =
                 local_2600._8_4_ * fVar73 + fVar65 * auVar88._8_4_ + fVar72 * auVar108._8_4_;
            auVar93._12_4_ =
                 local_2600._12_4_ * fVar73 + fVar65 * auVar88._12_4_ + fVar72 * auVar108._12_4_;
            auVar82._8_8_ = 0x8000000080000000;
            auVar82._0_8_ = 0x8000000080000000;
            auVar103 = vandps_avx(auVar93,auVar82);
            uVar55 = auVar103._0_4_;
            local_2540._0_4_ =
                 (float)(uVar55 ^ (uint)(fVar136 * auVar75._0_4_ +
                                        fVar24 * auVar97._0_4_ + fVar32 * auVar96._0_4_));
            uVar132 = auVar103._4_4_;
            local_2540._4_4_ =
                 (float)(uVar132 ^
                        (uint)(fVar138 * auVar75._4_4_ +
                              fVar25 * auVar97._4_4_ + fVar33 * auVar96._4_4_));
            uVar133 = auVar103._8_4_;
            local_2540._8_4_ =
                 (float)(uVar133 ^
                        (uint)(fVar139 * auVar75._8_4_ +
                              fVar26 * auVar97._8_4_ + fVar34 * auVar96._8_4_));
            uVar134 = auVar103._12_4_;
            local_2540._12_4_ =
                 (float)(uVar134 ^
                        (uint)(fVar140 * auVar75._12_4_ +
                              fVar27 * auVar97._12_4_ + fVar35 * auVar96._12_4_));
            local_2540._16_4_ =
                 (float)(uVar55 ^ (uint)(fVar40 * auVar75._0_4_ +
                                        fVar36 * auVar97._0_4_ + fVar28 * auVar96._0_4_));
            local_2540._20_4_ =
                 (float)(uVar132 ^
                        (uint)(fVar41 * auVar75._4_4_ +
                              fVar37 * auVar97._4_4_ + fVar29 * auVar96._4_4_));
            local_2540._24_4_ =
                 (float)(uVar133 ^
                        (uint)(fVar42 * auVar75._8_4_ +
                              fVar38 * auVar97._8_4_ + fVar30 * auVar96._8_4_));
            local_2540._28_4_ =
                 (float)(uVar134 ^
                        (uint)(fVar43 * auVar75._12_4_ +
                              fVar39 * auVar97._12_4_ + fVar31 * auVar96._12_4_));
            auVar96 = ZEXT416(0) << 0x20;
            auVar103 = vcmpps_avx(local_2540._0_16_,auVar96,5);
            auVar75 = vcmpps_avx(local_2540._16_16_,auVar96,5);
            auVar103 = vandps_avx(auVar103,auVar75);
            auVar83._8_4_ = 0x7fffffff;
            auVar83._0_8_ = 0x7fffffff7fffffff;
            auVar83._12_4_ = 0x7fffffff;
            local_2510 = vandps_avx(auVar93,auVar83);
            auVar75 = vcmpps_avx(auVar96,auVar93,4);
            auVar103 = vandps_avx(auVar103,auVar75);
            auVar84._0_4_ = local_2540._0_4_ + local_2540._16_4_;
            auVar84._4_4_ = local_2540._4_4_ + local_2540._20_4_;
            auVar84._8_4_ = local_2540._8_4_ + local_2540._24_4_;
            auVar84._12_4_ = local_2540._12_4_ + local_2540._28_4_;
            auVar75 = vcmpps_avx(auVar84,local_2510,2);
            auVar103 = vandps_avx(auVar103,auVar75);
            auVar18._8_8_ = uStack_2548;
            auVar18._0_8_ = local_2550;
            auVar18 = auVar18 & auVar103;
            if ((((auVar18 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar18 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar18 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar18[0xf] < '\0') {
              auVar44._8_8_ = uStack_2548;
              auVar44._0_8_ = local_2550;
              auVar103 = vandps_avx(auVar103,auVar44);
              local_2520._0_4_ =
                   (float)(uVar55 ^ (uint)(local_2600._0_4_ * fVar8 +
                                          fVar129 * auVar88._0_4_ + fVar74 * auVar108._0_4_));
              local_2520._4_4_ =
                   (float)(uVar132 ^
                          (uint)(local_2600._4_4_ * fVar11 +
                                fVar10 * auVar88._4_4_ + fVar9 * auVar108._4_4_));
              local_2520._8_4_ =
                   (float)(uVar133 ^
                          (uint)(local_2600._8_4_ * fVar14 +
                                fVar13 * auVar88._8_4_ + fVar12 * auVar108._8_4_));
              local_2520._12_4_ =
                   (float)(uVar134 ^
                          (uint)(local_2600._12_4_ * fVar17 +
                                fVar16 * auVar88._12_4_ + fVar15 * auVar108._12_4_));
              fVar65 = (ray->super_RayK<1>).org.field_0.m128[3];
              fVar72 = local_2510._0_4_;
              auVar68._0_4_ = fVar72 * fVar65;
              fVar73 = local_2510._4_4_;
              auVar68._4_4_ = fVar73 * fVar65;
              fVar74 = local_2510._8_4_;
              auVar68._8_4_ = fVar74 * fVar65;
              fVar129 = local_2510._12_4_;
              auVar68._12_4_ = fVar129 * fVar65;
              auVar75 = vcmpps_avx(auVar68,local_2520,1);
              fVar65 = (ray->super_RayK<1>).tfar;
              auVar85._0_4_ = fVar72 * fVar65;
              auVar85._4_4_ = fVar73 * fVar65;
              auVar85._8_4_ = fVar74 * fVar65;
              auVar85._12_4_ = fVar129 * fVar65;
              auVar96 = vcmpps_avx(local_2520,auVar85,2);
              auVar75 = vandps_avx(auVar96,auVar75);
              auVar96 = auVar103 & auVar75;
              if ((((auVar96 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar96 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar96 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar96[0xf] < '\0') {
                auVar119._0_4_ = (ray->super_RayK<1>).tfar;
                auVar119._4_4_ = (ray->super_RayK<1>).mask;
                auVar119._8_4_ = (ray->super_RayK<1>).id;
                auVar119._12_4_ = (ray->super_RayK<1>).flags;
                auVar103 = vandps_avx(auVar103,auVar75);
                local_24f0 = auVar103;
                local_24b0 = local_2600;
                local_2640 = auVar88._0_8_;
                uStack_2638 = auVar88._8_8_;
                local_24a0 = local_2640;
                uStack_2498 = uStack_2638;
                local_2670 = auVar108._0_8_;
                uStack_2668 = auVar108._8_8_;
                local_2490 = local_2670;
                uStack_2488 = uStack_2668;
                local_2590._0_8_ = context->scene;
                local_25f0 = auVar103;
                auVar75 = vrcpps_avx(local_2510);
                fVar65 = auVar75._0_4_;
                auVar86._0_4_ = fVar72 * fVar65;
                fVar72 = auVar75._4_4_;
                auVar86._4_4_ = fVar73 * fVar72;
                fVar73 = auVar75._8_4_;
                auVar86._8_4_ = fVar74 * fVar73;
                fVar74 = auVar75._12_4_;
                auVar86._12_4_ = fVar129 * fVar74;
                auVar94._8_4_ = 0x3f800000;
                auVar94._0_8_ = 0x3f8000003f800000;
                auVar94._12_4_ = 0x3f800000;
                auVar75 = vsubps_avx(auVar94,auVar86);
                fVar65 = fVar65 + fVar65 * auVar75._0_4_;
                fVar72 = fVar72 + fVar72 * auVar75._4_4_;
                fVar73 = fVar73 + fVar73 * auVar75._8_4_;
                fVar74 = fVar74 + fVar74 * auVar75._12_4_;
                auVar106._0_4_ = fVar65 * local_2520._0_4_;
                auVar106._4_4_ = fVar72 * local_2520._4_4_;
                auVar106._8_4_ = fVar73 * local_2520._8_4_;
                auVar106._12_4_ = fVar74 * local_2520._12_4_;
                local_24c0 = auVar106;
                local_24e0[0] = fVar65 * local_2540._0_4_;
                local_24e0[1] = fVar72 * local_2540._4_4_;
                local_24e0[2] = fVar73 * local_2540._8_4_;
                local_24e0[3] = fVar74 * local_2540._12_4_;
                local_24d0[0] = fVar65 * local_2540._16_4_;
                local_24d0[1] = fVar72 * local_2540._20_4_;
                local_24d0[2] = fVar73 * local_2540._24_4_;
                local_24d0[3] = fVar74 * local_2540._28_4_;
                auVar69._8_4_ = 0x7f800000;
                auVar69._0_8_ = 0x7f8000007f800000;
                auVar69._12_4_ = 0x7f800000;
                auVar75 = vblendvps_avx(auVar69,auVar106,auVar103);
                auVar108 = vshufps_avx(auVar75,auVar75,0xb1);
                auVar108 = vminps_avx(auVar108,auVar75);
                auVar96 = vshufpd_avx(auVar108,auVar108,1);
                auVar108 = vminps_avx(auVar96,auVar108);
                auVar75 = vcmpps_avx(auVar75,auVar108,0);
                auVar108 = auVar103 & auVar75;
                if ((((auVar108 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar108 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar108 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar108[0xf] < '\0') {
                  auVar103 = vandps_avx(auVar75,auVar103);
                }
                lVar57 = lVar57 + uVar53;
                local_2640._0_4_ = vextractps_avx(auVar119,1);
                stack0xffffffffffffd9c4 = auVar88._4_12_;
                uVar46 = vmovmskps_avx(auVar103);
                uVar63 = CONCAT44((int)((ulong)context->scene >> 0x20),uVar46);
                piVar51 = (int *)0x0;
                if (uVar63 != 0) {
                  for (; (uVar63 >> (long)piVar51 & 1) == 0; piVar51 = (int *)((long)piVar51 + 1)) {
                  }
                }
                do {
                  local_2600._0_8_ = piVar51;
                  uVar55 = *(uint *)(lVar57 + 0x90 + (long)piVar51 * 4);
                  lVar5 = *(long *)(*(long *)(local_2590._0_8_ + 0x1e8) + (ulong)uVar55 * 8);
                  if ((*(uint *)(lVar5 + 0x34) & local_2640._0_4_) == 0) {
                    *(undefined4 *)(local_25f0 + (long)piVar51 * 4) = 0;
                    uVar55 = local_2640._0_4_;
                  }
                  else {
                    pRVar6 = context->args;
                    local_2640 = (undefined1  [8])pRVar6;
                    if (pRVar6->filter == (RTCFilterFunctionN)0x0) {
                      pRVar52 = context->user;
                      if (*(long *)(lVar5 + 0x40) == 0) {
                        fVar65 = local_24e0[(long)piVar51];
                        fVar72 = local_24d0[(long)piVar51];
                        (ray->super_RayK<1>).tfar = *(float *)(local_24c0 + (long)piVar51 * 4);
                        (ray->Ng).field_0.field_0.x = *(float *)(local_24b0 + (long)piVar51 * 4);
                        (ray->Ng).field_0.field_0.y =
                             *(float *)((long)&local_24a0 + (long)piVar51 * 4);
                        (ray->Ng).field_0.field_0.z =
                             *(float *)((long)&local_2490 + (long)piVar51 * 4);
                        ray->u = fVar65;
                        ray->v = fVar72;
                        ray->primID = *(uint *)(lVar57 + 0xa0 + (long)piVar51 * 4);
                        ray->geomID = uVar55;
                        ray->instID[0] = pRVar52->instID[0];
                        ray->instPrimID[0] = pRVar52->instPrimID[0];
                        break;
                      }
                      local_25e0 = auVar119;
                      local_25d0 = auVar106;
                    }
                    else {
                      local_25e0 = auVar119;
                      local_25d0 = auVar106;
                      pRVar52 = context->user;
                    }
                    local_2610._0_8_ = uVar60;
                    local_2580 = *(undefined4 *)(local_24b0 + (long)piVar51 * 4);
                    local_257c = *(undefined4 *)((long)&local_24a0 + (long)piVar51 * 4);
                    local_2578 = *(undefined4 *)((long)&local_2490 + (long)piVar51 * 4);
                    local_2574 = local_24e0[(long)piVar51];
                    local_2570 = local_24d0[(long)piVar51];
                    local_256c = *(undefined4 *)(lVar57 + 0xa0 + (long)piVar51 * 4);
                    local_2568 = uVar55;
                    local_2564 = pRVar52->instID[0];
                    local_2560 = pRVar52->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_24c0 + (long)piVar51 * 4);
                    local_2614 = -1;
                    local_25c0.valid = &local_2614;
                    local_25c0.geometryUserPtr = *(void **)(lVar5 + 0x18);
                    local_25c0.context = pRVar52;
                    local_25c0.ray = (RTCRayN *)ray;
                    local_25c0.hit = (RTCHitN *)&local_2580;
                    local_25c0.N = 1;
                    local_25e0 = auVar119;
                    local_25d0 = auVar106;
                    if (((*(code **)(lVar5 + 0x40) == (code *)0x0) ||
                        ((**(code **)(lVar5 + 0x40))(&local_25c0), *local_25c0.valid != 0)) &&
                       ((pRVar6->filter == (RTCFilterFunctionN)0x0 ||
                        ((((pRVar6->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT && ((*(byte *)(lVar5 + 0x3e) & 0x40) == 0))
                         || ((*pRVar6->filter)(&local_25c0), *local_25c0.valid != 0)))))) {
                      (((Vec3f *)((long)local_25c0.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_25c0.hit;
                      (((Vec3f *)((long)local_25c0.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_25c0.hit + 4);
                      (((Vec3f *)((long)local_25c0.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_25c0.hit + 8);
                      *(float *)((long)local_25c0.ray + 0x3c) = *(float *)(local_25c0.hit + 0xc);
                      *(float *)((long)local_25c0.ray + 0x40) = *(float *)(local_25c0.hit + 0x10);
                      *(float *)((long)local_25c0.ray + 0x44) = *(float *)(local_25c0.hit + 0x14);
                      *(float *)((long)local_25c0.ray + 0x48) = *(float *)(local_25c0.hit + 0x18);
                      *(float *)((long)local_25c0.ray + 0x4c) = *(float *)(local_25c0.hit + 0x1c);
                      *(float *)((long)local_25c0.ray + 0x50) = *(float *)(local_25c0.hit + 0x20);
                    }
                    else {
                      (ray->super_RayK<1>).tfar = (float)local_25e0._0_4_;
                    }
                    *(undefined4 *)(local_25f0 + local_2600._0_8_ * 4) = 0;
                    fVar65 = (ray->super_RayK<1>).tfar;
                    auVar70._4_4_ = fVar65;
                    auVar70._0_4_ = fVar65;
                    auVar70._8_4_ = fVar65;
                    auVar70._12_4_ = fVar65;
                    auVar103 = vcmpps_avx(local_25d0,auVar70,2);
                    local_25f0 = vandps_avx(auVar103,local_25f0);
                    auVar119._0_4_ = (ray->super_RayK<1>).tfar;
                    auVar119._4_4_ = (ray->super_RayK<1>).mask;
                    auVar119._8_4_ = (ray->super_RayK<1>).id;
                    auVar119._12_4_ = (ray->super_RayK<1>).flags;
                    uVar55 = vextractps_avx(auVar119,1);
                    uVar60 = local_2610._0_8_;
                    auVar106 = local_25d0;
                  }
                  local_2640._0_4_ = uVar55;
                  local_25e0 = auVar119;
                  if ((((local_25f0 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_25f0 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_25f0 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_25f0[0xf]) break;
                  local_2610._0_8_ = uVar60;
                  local_25d0 = auVar106;
                  BVHNIntersector1<8,1048576,false,embree::avx::ArrayIntersector1<embree::avx::TriangleMIntersector1Moeller<4,true>>>
                  ::intersect(&local_25c0);
                  piVar51 = local_25c0.valid;
                  uVar60 = local_2610._0_8_;
                  auVar106 = local_25d0;
                  auVar119 = local_25e0;
                } while( true );
              }
            }
            lVar59 = lVar59 + 1;
          } while (lVar59 != uVar50 - 8);
        }
        fVar65 = (ray->super_RayK<1>).tfar;
        auVar71 = ZEXT3264(CONCAT428(fVar65,CONCAT424(fVar65,CONCAT420(fVar65,CONCAT416(fVar65,
                                                  CONCAT412(fVar65,CONCAT48(fVar65,CONCAT44(fVar65,
                                                  fVar65))))))));
        auVar135 = ZEXT3264(local_23e0);
        auVar137 = ZEXT3264(local_2400);
        auVar145 = ZEXT3264(local_2420);
        auVar146 = ZEXT3264(local_2440);
        auVar148 = ZEXT3264(local_2460);
        auVar150 = ZEXT3264(local_2480);
      }
    } while (pauVar48 != (undefined1 (*) [16])&local_23a0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }